

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tests.cpp
# Opt level: O0

void parse<TopologyCommand>(string *query_text)

{
  AssertionHandler catchAssertionHandler;
  Command cmd;
  undefined4 in_stack_fffffffffffffea8;
  Flags in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  AssertionHandler *this;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  AssertionHandler *in_stack_fffffffffffffec0;
  StringRef in_stack_fffffffffffffec8;
  ExprLhs<bool> *in_stack_fffffffffffffed8;
  AssertionHandler *in_stack_fffffffffffffee0;
  string *in_stack_ffffffffffffff58;
  
  parse_command(in_stack_ffffffffffffff58);
  operator____catch_sr
            (in_stack_fffffffffffffeb0,CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
            );
  this = (AssertionHandler *)&stack0xfffffffffffffed8;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/Tests.cpp",
             0x2a);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffec0,
             (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffec0,
             (StringRef *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (SourceLineInfo *)this,in_stack_fffffffffffffec8,in_stack_fffffffffffffeac);
  std::
  holds_alternative<TopologyCommand,SelectCommand,IndexCommand,IndexFromCommand,IteratorPopCommand,ReindexCommand,CompactCommand,ConfigGetCommand,ConfigSetCommand,StatusCommand,TopologyCommand,PingCommand,TaintCommand,DatasetDropCommand>
            ((variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
              *)0x1aa4ae);
  Catch::Decomposer::operator<=
            ((Decomposer *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  std::
  get<TopologyCommand,SelectCommand,IndexCommand,IndexFromCommand,IteratorPopCommand,ReindexCommand,CompactCommand,ConfigGetCommand,ConfigSetCommand,StatusCommand,TopologyCommand,PingCommand,TaintCommand,DatasetDropCommand>
            ((variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
              *)0x1aa541);
  Catch::clara::std::
  variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
  ::~variant((variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
              *)0x1aa550);
  return;
}

Assistant:

T parse(const std::string &query_text) {
    Command cmd = parse_command(query_text);
    REQUIRE(std::holds_alternative<T>(cmd));
    return std::move(std::get<T>(cmd));
}